

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * wabt::anon_unknown_0::GetMemoryAPIString
                   (string *__return_storage_ptr__,Memory *memory,string *api)

{
  bool bVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  string *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  string suffix;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  local_68 = 0;
  local_60 = 0;
  local_70 = &local_60;
  if ((memory->page_limits).is_shared == true) {
    std::__cxx11::string::append((char *)&local_70);
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)api);
  iVar3 = std::__cxx11::string::compare((char *)local_50);
  if ((iVar3 == 0) || (memory->page_size != 0x10000)) {
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    bVar1 = (memory->page_limits).is_64;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (bVar1 == false) {
      std::__cxx11::string::append((char *)&local_70);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (api->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + api->_M_string_length);
  psVar4 = (string *)std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70)
  ;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

static std::string GetMemoryAPIString(const Memory& memory, std::string api) {
  std::string suffix;
  if (memory.page_limits.is_shared) {
    suffix += "_shared";
  }

  // Memory load and store routines can be optimized for default-page-size,
  // 32-bit memories (by using hardware to bounds-check memory access).
  // Append "_default32" to these function names to choose the (possibly) fast
  // path.
  //
  // We don't need to do this for runtime routines; those can check the
  // wasm_rt_memory_t structure.
  if (api.substr(0, 8) != "wasm_rt_" &&
      memory.page_size == WABT_DEFAULT_PAGE_SIZE &&
      memory.page_limits.is_64 == false) {
    suffix += "_default32";
  }
  return api + suffix;
}